

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> out;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  undefined1 in_stack_00000000 [16];
  undefined8 local_30;
  undefined4 local_28;
  int in_stack_ffffffffffffffdc;
  unsigned_long in_stack_ffffffffffffffe0;
  undefined1 local_18;
  
  out.super_truncating_iterator_base<char_*>.limit_ = in_RDI;
  out.super_truncating_iterator_base<char_*>.out_ = (char *)in_RSI;
  out._16_16_ = in_stack_00000000;
  internal::
  format_decimal<char,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_long>
            (out,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  *in_RSI = local_30;
  in_RSI[1] = CONCAT44(in_stack_ffffffffffffffdc,local_28);
  in_RSI[2] = in_stack_ffffffffffffffe0;
  *(undefined1 *)(in_RSI + 3) = local_18;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }